

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

boolean match_warn_of_mon(monst *mon)

{
  long lVar1;
  
  if ((((uwep != (obj *)0x0) && (lVar1 = (long)uwep->oartifact, lVar1 != 0)) &&
      ((artilist[lVar1].spfx & 0x8000000) != 0)) &&
     ((artilist[lVar1].mtype != 0 && (artilist[lVar1].mtype == (long)mon->data->mlet)))) {
    return '\x01';
  }
  if (flags.warntype != 0 && (u.uprops[0x41].extrinsic != 0 || u.uprops[0x41].intrinsic != 0)) {
    return (mon->data->mflags2 & flags.warntype) != 0;
  }
  return '\0';
}

Assistant:

boolean match_warn_of_mon(const struct monst *mon)
{
	/* warned of S_MONSTER? */
	if (uwep && uwep->oartifact) {
	    const struct artifact *arti = get_artifact(uwep);
	    if (arti->spfx & SPFX_WARN_S &&
		arti->mtype && arti->mtype == mon->data->mlet) {
		return TRUE;
	    }
	}

	return Warn_of_mon && flags.warntype &&
	       (flags.warntype & mon->data->mflags2);
}